

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O3

void __thiscall
OpenMD::DataStorage::internalResize<OpenMD::SquareMatrix3<double>>
          (DataStorage *this,
          vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *v,
          size_t newSize)

{
  pointer pSVar1;
  iterator __beg;
  long lVar2;
  size_type __n;
  value_type local_48;
  
  pSVar1 = (v->
           super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(v->
                super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
  __n = newSize + (lVar2 >> 3) * 0x71c71c71c71c71c7;
  if (__n != 0) {
    if (newSize < (ulong)((lVar2 >> 3) * -0x71c71c71c71c71c7) || __n == 0) {
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      _M_erase(v,pSVar1 + newSize,(SquareMatrix3<double> *)(lVar2 + (long)pSVar1));
      return;
    }
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_48.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    _M_fill_insert(v,(SquareMatrix3<double> *)((long)pSVar1 + lVar2),__n,&local_48);
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }